

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qopengltextureblitter.cpp
# Opt level: O1

QMatrix3x3 *
QOpenGLTextureBlitter::sourceTransform
          (QMatrix3x3 *__return_storage_ptr__,QRectF *subTexture,QSize *textureSize,Origin origin)

{
  double dVar1;
  double dVar2;
  int iVar3;
  int iVar4;
  double dVar5;
  long lVar6;
  float (*pafVar7) [3];
  int row;
  long lVar8;
  double dVar9;
  double dVar10;
  float fVar11;
  double dVar12;
  
  dVar1 = subTexture->w;
  iVar3 = (textureSize->wd).m_i;
  iVar4 = (textureSize->ht).m_i;
  dVar9 = subTexture->h;
  dVar2 = subTexture->xp;
  dVar10 = subTexture->yp;
  __return_storage_ptr__->m[1][1] = -NAN;
  __return_storage_ptr__->m[1][2] = -NAN;
  __return_storage_ptr__->m[2][0] = -NAN;
  __return_storage_ptr__->m[2][1] = -NAN;
  __return_storage_ptr__->m[0][0] = -NAN;
  __return_storage_ptr__->m[0][1] = -NAN;
  __return_storage_ptr__->m[0][2] = -NAN;
  __return_storage_ptr__->m[1][0] = -NAN;
  __return_storage_ptr__->m[2][2] = -NAN;
  lVar6 = 0;
  pafVar7 = (float (*) [3])__return_storage_ptr__;
  do {
    lVar8 = 0;
    do {
      fVar11 = 1.0;
      if (lVar6 != lVar8) {
        fVar11 = 0.0;
      }
      (*(float (*) [3])*pafVar7)[lVar8] = fVar11;
      lVar8 = lVar8 + 1;
    } while (lVar8 != 3);
    lVar6 = lVar6 + 1;
    pafVar7 = pafVar7 + 1;
  } while (lVar6 != 3);
  dVar5 = (double)iVar3;
  dVar12 = (double)iVar4;
  dVar10 = dVar10 / dVar12;
  if (origin == OriginTopLeft) {
    dVar10 = 1.0 - dVar10;
  }
  dVar9 = dVar9 / dVar12;
  if (origin == OriginTopLeft) {
    dVar9 = -dVar9;
  }
  *(ulong *)__return_storage_ptr__->m[2] = CONCAT44((float)dVar10,(float)(dVar2 / dVar5));
  __return_storage_ptr__->m[0][0] = (float)(dVar1 / dVar5);
  __return_storage_ptr__->m[1][1] = (float)dVar9;
  return __return_storage_ptr__;
}

Assistant:

QMatrix3x3 QOpenGLTextureBlitter::sourceTransform(const QRectF &subTexture,
                                                  const QSize &textureSize,
                                                  Origin origin)
{
    qreal x_scale = subTexture.width() / textureSize.width();
    qreal y_scale = subTexture.height() / textureSize.height();

    const QPointF topLeft = subTexture.topLeft();
    qreal x_translate = topLeft.x() / textureSize.width();
    qreal y_translate = topLeft.y() / textureSize.height();

    if (origin == OriginTopLeft) {
        y_scale = -y_scale;
        y_translate = 1 - y_translate;
    }

    QMatrix3x3 matrix;
    matrix(0,2) = x_translate;
    matrix(1,2) = y_translate;

    matrix(0,0) = x_scale;
    matrix(1,1) = y_scale;

    return matrix;
}